

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Table.cxx
# Opt level: O0

long __thiscall Fl_Table::row_scroll_position(Fl_Table *this,int row)

{
  int iVar1;
  int local_24;
  long lStack_20;
  int t;
  long scroll;
  int startrow;
  int row_local;
  Fl_Table *this_local;
  
  scroll._0_4_ = 0;
  lStack_20 = 0;
  if ((this->toprow_scrollpos != -1) && (this->toprow <= row)) {
    lStack_20 = (long)this->toprow_scrollpos;
    scroll._0_4_ = this->toprow;
  }
  for (local_24 = (int)scroll; local_24 < row; local_24 = local_24 + 1) {
    iVar1 = row_height(this,local_24);
    lStack_20 = iVar1 + lStack_20;
  }
  return lStack_20;
}

Assistant:

long Fl_Table::row_scroll_position(int row) {
  int startrow = 0;
  long scroll = 0; 
  // OPTIMIZATION: 
  //     Attempt to use precomputed row scroll position
  //
  if ( toprow_scrollpos != -1 && row >= toprow ) {
    scroll = toprow_scrollpos;
    startrow = toprow;
  }
  for ( int t=startrow; t<row; t++ ) {
    scroll += row_height(t);
  }
  return(scroll);
}